

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::GenPackageReference_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,Type *type)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string local_30;
  
  if (type->struct_def == (StructDef *)0x0) {
    if (type->enum_def == (EnumDef *)0x0) {
      GenTypeGet_abi_cxx11_(&local_30,this,type);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x38553a);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        lVar1 = plVar2[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      }
      __return_storage_ptr__->_M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      ModuleFor<flatbuffers::EnumDef>(__return_storage_ptr__,this,type->enum_def);
    }
  }
  else {
    ModuleFor<flatbuffers::StructDef>(__return_storage_ptr__,this,type->struct_def);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenPackageReference(const Type &type) const {
    if (type.struct_def) return ModuleFor(type.struct_def);
    if (type.enum_def) return ModuleFor(type.enum_def);
    return "." + GenTypeGet(type);
  }